

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O1

void __thiscall AMColorset::initFromCVars(AMColorset *this,FColorCVar **values)

{
  FColorCVar *pFVar1;
  uint r;
  byte bVar2;
  int i;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  lVar3 = 0;
  do {
    pFVar1 = values[lVar3];
    this->c[lVar3].Index = pFVar1->Index;
    this->c[lVar3].RGB = (pFVar1->super_FIntCVar).Value | 0xff000000;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x17);
  uVar4 = ((*values)->super_FIntCVar).Value;
  uVar6 = uVar4 >> 0x10 & 0xff;
  uVar5 = uVar4 >> 8 & 0xff;
  uVar4 = uVar4 & 0xff;
  r = uVar6 - 0x10;
  if (uVar6 < 0x10) {
    r = uVar6 | 0x10;
  }
  uVar6 = uVar5 - 0x10;
  if (uVar5 < 0x10) {
    uVar6 = uVar5 | 0x10;
  }
  uVar5 = uVar4 - 0x10;
  if (uVar4 < 0x10) {
    uVar5 = uVar4 | 0x10;
  }
  this->c[0x17].RGB = uVar6 << 8 | r << 0x10 | uVar5 | 0xff000000;
  bVar2 = FColorMatcher::Pick(&ColorMatcher,r,uVar6,uVar5);
  this->c[0x17].Index = (uint)bVar2;
  this->displayLocks = true;
  this->forcebackground = false;
  return;
}

Assistant:

void initFromCVars(FColorCVar **values)
	{
		for(int i=0;i<AlmostBackgroundColor; i++)
		{
			c[i].FromCVar(*values[i]);
		}

		DWORD ba = *(values[0]);

		int r = RPART(ba) - 16;
		int g = GPART(ba) - 16;
		int b = BPART(ba) - 16;

		if (r < 0)
			r += 32;
		if (g < 0)
			g += 32;
		if (b < 0)
			b += 32;

		c[AlmostBackgroundColor].FromRGB(r, g, b);
		displayLocks = true;
		forcebackground = false;
	}